

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O0

void test_qclab_qgates_QGate1<std::complex<double>>(void)

{
  undefined1 *this;
  complex<double> m10;
  complex<double> m10_00;
  complex<double> m10_01;
  complex<double> m10_02;
  complex<double> m10_03;
  complex<double> m10_04;
  complex<double> m10_05;
  complex<double> m10_06;
  complex<double> m11;
  complex<double> m11_00;
  complex<double> m11_01;
  complex<double> m11_02;
  complex<double> m11_03;
  complex<double> m11_04;
  complex<double> m11_05;
  complex<double> m11_06;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<std::complex<double>_> __l_02;
  initializer_list<std::complex<double>_> __l_03;
  initializer_list<std::complex<double>_> __l_04;
  initializer_list<std::complex<double>_> __l_05;
  initializer_list<std::complex<double>_> __l_06;
  initializer_list<std::complex<double>_> __l_07;
  initializer_list<std::complex<double>_> __l_08;
  initializer_list<std::complex<double>_> __l_09;
  initializer_list<std::complex<double>_> __l_10;
  initializer_list<std::complex<double>_> __l_11;
  initializer_list<std::complex<double>_> __l_12;
  initializer_list<std::complex<double>_> __l_13;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  char *pcVar21;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar22;
  undefined8 uVar23;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  Message *pMVar24;
  undefined8 uVar25;
  char *in_R9;
  complex<double> m00;
  complex<double> m00_00;
  complex<double> m00_01;
  complex<double> m00_02;
  complex<double> m00_03;
  complex<double> m00_04;
  complex<double> m00_05;
  complex<double> m00_06;
  complex<double> m01;
  complex<double> m01_00;
  complex<double> m01_01;
  complex<double> m01_02;
  complex<double> m01_03;
  complex<double> m01_04;
  complex<double> m01_05;
  complex<double> m01_06;
  undefined1 in_stack_ffffffffffffe8a8;
  undefined1 in_stack_ffffffffffffe8a9;
  undefined1 in_stack_ffffffffffffe8aa;
  undefined1 in_stack_ffffffffffffe8ab;
  undefined1 in_stack_ffffffffffffe8ac;
  undefined1 in_stack_ffffffffffffe8ad;
  undefined1 in_stack_ffffffffffffe8ae;
  undefined1 in_stack_ffffffffffffe8af;
  undefined1 in_stack_ffffffffffffe8b0;
  undefined1 in_stack_ffffffffffffe8b1;
  undefined1 in_stack_ffffffffffffe8b2;
  undefined1 in_stack_ffffffffffffe8b3;
  undefined1 in_stack_ffffffffffffe8b4;
  undefined1 in_stack_ffffffffffffe8b5;
  undefined1 in_stack_ffffffffffffe8b6;
  undefined1 in_stack_ffffffffffffe8b7;
  undefined1 in_stack_ffffffffffffe8b8;
  undefined1 in_stack_ffffffffffffe8b9;
  undefined1 in_stack_ffffffffffffe8ba;
  undefined1 in_stack_ffffffffffffe8bb;
  allocator<std::complex<double>_> *paVar26;
  string local_16d0;
  AssertHelper local_16b0;
  Message local_16a8;
  SquareMatrix<std::complex<double>_> local_16a0;
  SquareMatrix<std::complex<double>_> local_1690;
  bool local_1679;
  undefined1 local_1678 [8];
  AssertionResult gtest_ar__31;
  SquareMatrix<std::complex<double>_> mat3_3;
  AssertHelper local_1638;
  Message local_1630;
  SquareMatrix<std::complex<double>_> local_1628;
  bool local_1611;
  undefined1 local_1610 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_15e0;
  Message local_15d8;
  SquareMatrix<std::complex<double>_> local_15d0;
  bool local_15b9;
  undefined1 local_15b8 [8];
  AssertionResult gtest_ar__29;
  SquareMatrix<std::complex<double>_> mat2_3;
  AssertHelper local_1578;
  Message local_1570;
  bool local_1561;
  undefined1 local_1560 [8];
  AssertionResult gtest_ar__28;
  complex<double> local_1540;
  complex<double> local_1530;
  complex<double> local_1520;
  undefined1 local_1510 [8];
  M check1_5;
  complex<double> local_14f0;
  complex<double> local_14e0;
  complex<double> local_14d0;
  SquareMatrix<std::complex<double>_> local_14c0;
  string local_14b0;
  AssertHelper local_1490;
  Message local_1488;
  undefined1 local_1479 [9];
  AssertionResult gtest_ar__27;
  SquareMatrix<std::complex<double>_> mat1_3;
  undefined1 local_1448 [8];
  M Ytrans_1;
  RotationY<std::complex<double>_> Y_2;
  AssertHelper local_13f8;
  Message local_13f0;
  SquareMatrix<std::complex<double>_> local_13e8;
  SquareMatrix<std::complex<double>_> local_13d8;
  bool local_13c1;
  undefined1 local_13c0 [8];
  AssertionResult gtest_ar__26;
  SquareMatrix<std::complex<double>_> mat3_2;
  AssertHelper local_1380;
  Message local_1378;
  SquareMatrix<std::complex<double>_> local_1370;
  bool local_1359;
  undefined1 local_1358 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_1328;
  Message local_1320;
  SquareMatrix<std::complex<double>_> local_1318;
  bool local_1301;
  undefined1 local_1300 [8];
  AssertionResult gtest_ar__24;
  SquareMatrix<std::complex<double>_> mat2_2;
  AssertHelper local_12c0;
  Message local_12b8;
  bool local_12a9;
  undefined1 local_12a8 [8];
  AssertionResult gtest_ar__23;
  complex<double> local_1288;
  complex<double> local_1278;
  complex<double> local_1268;
  undefined1 local_1258 [8];
  M check1_4;
  complex<double> local_1238;
  complex<double> local_1228;
  complex<double> local_1218;
  SquareMatrix<std::complex<double>_> local_1208;
  string local_11f8;
  AssertHelper local_11d8;
  Message local_11d0;
  undefined1 local_11c1 [9];
  AssertionResult gtest_ar__22;
  SquareMatrix<std::complex<double>_> mat1_2;
  undefined1 local_1190 [8];
  M Ytrans;
  RotationY<std::complex<double>_> Y_1;
  AssertHelper local_1140;
  Message local_1138;
  SquareMatrix<std::complex<double>_> local_1130;
  SquareMatrix<std::complex<double>_> local_1120;
  SquareMatrix<std::complex<double>_> local_1110;
  bool local_10f9;
  undefined1 local_10f8 [8];
  AssertionResult gtest_ar__21;
  SquareMatrix<std::complex<double>_> mat3_1;
  AssertHelper local_10b8;
  Message local_10b0;
  SquareMatrix<std::complex<double>_> local_10a8;
  SquareMatrix<std::complex<double>_> local_1098;
  bool local_1081;
  undefined1 local_1080 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_1050;
  Message local_1048;
  SquareMatrix<std::complex<double>_> local_1040;
  SquareMatrix<std::complex<double>_> local_1030;
  bool local_1019;
  undefined1 local_1018 [8];
  AssertionResult gtest_ar__19;
  SquareMatrix<std::complex<double>_> mat2_1;
  AssertHelper local_fd8;
  Message local_fd0;
  bool local_fc1;
  undefined1 local_fc0 [8];
  AssertionResult gtest_ar__18;
  complex<double> local_fa0;
  complex<double> local_f90;
  complex<double> local_f80;
  undefined1 local_f70 [8];
  M check1_3;
  complex<double> local_f50;
  complex<double> local_f40;
  complex<double> local_f30;
  SquareMatrix<std::complex<double>_> local_f20;
  string local_f10;
  AssertHelper local_ef0;
  Message local_ee8;
  SquareMatrix<std::complex<double>_> local_ee0;
  undefined1 local_ec9 [9];
  AssertionResult gtest_ar__17;
  SquareMatrix<std::complex<double>_> mat1_1;
  PauliX<std::complex<double>_> X_2;
  AssertHelper local_e78;
  Message local_e70;
  SquareMatrix<std::complex<double>_> local_e68;
  SquareMatrix<std::complex<double>_> local_e58;
  SquareMatrix<std::complex<double>_> local_e48;
  bool local_e31;
  undefined1 local_e30 [8];
  AssertionResult gtest_ar__16;
  SquareMatrix<std::complex<double>_> mat3;
  AssertHelper local_df0;
  Message local_de8;
  SquareMatrix<std::complex<double>_> local_de0;
  SquareMatrix<std::complex<double>_> local_dd0;
  bool local_db9;
  undefined1 local_db8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_d88;
  Message local_d80;
  SquareMatrix<std::complex<double>_> local_d78;
  SquareMatrix<std::complex<double>_> local_d68;
  bool local_d51;
  undefined1 local_d50 [8];
  AssertionResult gtest_ar__14;
  SquareMatrix<std::complex<double>_> mat2;
  AssertHelper local_d10;
  Message local_d08;
  bool local_cf9;
  undefined1 local_cf8 [8];
  AssertionResult gtest_ar__13;
  complex<double> local_cd8;
  complex<double> local_cc8;
  complex<double> local_cb8;
  undefined1 local_ca8 [8];
  M check1_2;
  complex<double> local_c88;
  complex<double> local_c78;
  complex<double> local_c68;
  SquareMatrix<std::complex<double>_> local_c58;
  string local_c48;
  AssertHelper local_c28;
  Message local_c20;
  SquareMatrix<std::complex<double>_> local_c18;
  undefined1 local_c01 [9];
  AssertionResult gtest_ar__12;
  SquareMatrix<std::complex<double>_> mat1;
  PauliX<std::complex<double>_> X_1;
  AssertHelper local_bb0;
  Message local_ba8;
  bool local_b99;
  undefined1 local_b98 [8];
  AssertionResult gtest_ar__11;
  string local_af0;
  AssertHelper local_ad0;
  Message local_ac8;
  bool local_ab9;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar__10;
  string local_a18;
  AssertHelper local_9f8;
  Message local_9f0;
  bool local_9e1;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar__9;
  complex<double> local_9c8;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  iterator local_940;
  size_type local_938;
  undefined1 local_930 [8];
  V check3_1;
  V vec3_1;
  AssertHelper local_8e0;
  Message local_8d8;
  bool local_8c9;
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar__8;
  string local_868;
  AssertHelper local_848;
  Message local_840;
  bool local_831;
  undefined1 local_830 [8];
  AssertionResult gtest_ar__7;
  complex<double> local_818;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  iterator local_7d8;
  size_type local_7d0;
  undefined1 local_7c8 [8];
  V check2_1;
  V vec2_1;
  AssertHelper local_778;
  Message local_770;
  bool local_761;
  undefined1 local_760 [8];
  AssertionResult gtest_ar__6;
  complex<double> local_748;
  undefined8 local_738;
  undefined8 uStack_730;
  iterator local_720;
  size_type local_718;
  undefined1 local_710 [8];
  V check1_1;
  V vec1_1;
  RotationY<std::complex<double>_> Y;
  AssertHelper local_6a0;
  Message local_698;
  bool local_689;
  undefined1 local_688 [8];
  AssertionResult gtest_ar__5;
  string local_5e0;
  AssertHelper local_5c0;
  Message local_5b8;
  bool local_5a9;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar__4;
  string local_508;
  AssertHelper local_4e8;
  Message local_4e0;
  bool local_4d1;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar__3;
  complex<double> local_4b8;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  iterator local_430;
  size_type local_428;
  undefined1 local_420 [8];
  V check3;
  V vec3;
  AssertHelper local_3d0;
  Message local_3c8;
  bool local_3b9;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar__2;
  string local_358;
  AssertHelper local_338;
  Message local_330;
  bool local_321;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__1;
  complex<double> local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  iterator local_2c8;
  size_type local_2c0;
  undefined1 local_2b8 [8];
  V check2;
  V vec2;
  AssertHelper local_268;
  Message local_260;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_;
  complex<double> local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  iterator local_210;
  size_type local_208;
  undefined1 local_200 [8];
  V check1;
  V vec1;
  PauliX<std::complex<double>_> X;
  complex<double> local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  iterator local_138;
  size_type local_130;
  undefined1 local_128 [8];
  V v3;
  complex<double> local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  iterator local_c8;
  size_type local_c0;
  undefined1 local_b8 [8];
  V v2;
  complex<double> local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  V v1;
  SquareMatrix<std::complex<double>_> I3;
  undefined1 local_28 [8];
  SquareMatrix<std::complex<double>_> I2;
  SquareMatrix<std::complex<double>_> I1;
  
  qclab::dense::eye<std::complex<double>>((int64_t)&I2.data_);
  qclab::dense::eye<std::complex<double>>((int64_t)local_28);
  qclab::dense::eye<std::complex<double>>
            ((int64_t)&v1.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_88 = 0x4014000000000000;
  uStack_80 = 0;
  local_98._M_value._0_8_ = 0x4008000000000000;
  local_98._M_value._8_8_ = 0;
  local_70 = &local_98;
  local_68 = 2;
  paVar26 = (allocator<std::complex<double>_> *)
            ((long)&v2.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<double>_>::allocator(paVar26);
  __l_13._M_len = local_68;
  __l_13._M_array = local_70;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_60,__l_13
             ,paVar26);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&v2.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_d8 = 0x401c000000000000;
  uStack_d0 = 0;
  local_e8 = 0x4000000000000000;
  uStack_e0 = 0;
  local_f8 = 0x4014000000000000;
  uStack_f0 = 0;
  local_108._M_value._0_8_ = 0x4008000000000000;
  local_108._M_value._8_8_ = 0;
  local_c8 = &local_108;
  local_c0 = 4;
  paVar26 = (allocator<std::complex<double>_> *)
            ((long)&v3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<double>_>::allocator(paVar26);
  __l_12._M_len = local_c0;
  __l_12._M_array = local_c8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_b8,__l_12
             ,paVar26);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&v3.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_148 = 0x4008000000000000;
  uStack_140 = 0;
  local_158 = 0x4020000000000000;
  uStack_150 = 0;
  local_168 = 0x3ff0000000000000;
  uStack_160 = 0;
  local_178 = 0x4010000000000000;
  uStack_170 = 0;
  local_188 = 0x401c000000000000;
  uStack_180 = 0;
  local_198 = 0x4000000000000000;
  uStack_190 = 0;
  local_1a8 = 0x4014000000000000;
  uStack_1a0 = 0;
  local_1b8._M_value._0_8_ = 0x4008000000000000;
  local_1b8._M_value._8_8_ = 0;
  local_138 = &local_1b8;
  local_130 = 8;
  this = &X.super_QGate1<std::complex<double>_>.field_0xf;
  std::allocator<std::complex<double>_>::allocator((allocator<std::complex<double>_> *)this);
  __l_11._M_len = local_130;
  __l_11._M_array = local_138;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_128,
             __l_11,(allocator_type *)this);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)&X.super_QGate1<std::complex<double>_>.field_0xf);
  qclab::qgates::PauliX<std::complex<double>_>::PauliX
            ((PauliX<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_60);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,1,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_228 = 0x4008000000000000;
  uStack_220 = 0;
  local_238._M_value._0_8_ = 0x4014000000000000;
  local_238._M_value._8_8_ = 0;
  local_210 = &local_238;
  local_208 = 2;
  paVar26 = (allocator<std::complex<double>_> *)
            ((long)&gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<std::complex<double>_>::allocator(paVar26);
  __l_10._M_len = local_208;
  __l_10._M_array = local_210;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_200,
             __l_10,paVar26);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_251 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check1.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_200);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_250,&local_251,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec2.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_250,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x1d,pcVar21);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    std::__cxx11::string::~string
              ((string *)
               &vec2.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_b8);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_2d8 = 0x4014000000000000;
  uStack_2d0 = 0;
  local_2e8 = 0x4008000000000000;
  uStack_2e0 = 0;
  local_2f8 = 0x401c000000000000;
  uStack_2f0 = 0;
  local_308._M_value._0_8_ = 0x4000000000000000;
  local_308._M_value._8_8_ = 0;
  local_2c8 = &local_308;
  local_2c0 = 4;
  paVar26 = (allocator<std::complex<double>_> *)
            ((long)&gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<std::complex<double>_>::allocator(paVar26);
  __l_09._M_len = local_2c0;
  __l_09._M_array = local_2c8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2b8,
             __l_09,paVar26);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_321 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check2.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_2b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_320,&local_321,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_358,(internal *)local_320,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x29,pcVar21);
    testing::internal::AssertHelper::operator=(&local_338,&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_b8);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4014000000000000;
  __l_08._M_len = 4;
  __l_08._M_array = (iterator)&gtest_ar__2.message_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2b8,
             __l_08);
  local_3b9 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check2.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_2b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3b8,&local_3b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_3b8,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x35,pcVar21);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string
              ((string *)
               &vec3.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_128);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_448 = 0x3ff0000000000000;
  uStack_440 = 0;
  local_458 = 0x4010000000000000;
  uStack_450 = 0;
  local_468 = 0x4008000000000000;
  uStack_460 = 0;
  local_478 = 0x4020000000000000;
  uStack_470 = 0;
  local_488 = 0x4014000000000000;
  uStack_480 = 0;
  local_498 = 0x4008000000000000;
  uStack_490 = 0;
  local_4a8 = 0x401c000000000000;
  uStack_4a0 = 0;
  local_4b8._M_value._0_8_ = 0x4000000000000000;
  local_4b8._M_value._8_8_ = 0;
  local_430 = &local_4b8;
  local_428 = 8;
  paVar26 = (allocator<std::complex<double>_> *)
            ((long)&gtest_ar__3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<std::complex<double>_>::allocator(paVar26);
  __l_07._M_len = local_428;
  __l_07._M_array = local_430;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_420,
             __l_07,paVar26);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_4d1 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check3.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_420);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d0,&local_4d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_508,(internal *)local_4d0,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x41,pcVar21);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_128);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4010000000000000;
  __l_06._M_len = 8;
  __l_06._M_array = (iterator)&gtest_ar__4.message_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_420,
             __l_06);
  local_5a9 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check3.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_420);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5a8,&local_5a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5e0,(internal *)local_5a8,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x4d,pcVar21);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,2);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_128);
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4014000000000000;
  __l_05._M_len = 8;
  __l_05._M_array = (iterator)&gtest_ar__5.message_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_420,
             __l_05);
  local_689 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check3.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_420);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_688,&local_689,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_,
               (internal *)local_688,(AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x59,pcVar21);
    testing::internal::AssertHelper::operator=(&local_6a0,&local_698);
    testing::internal::AssertHelper::~AssertHelper(&local_6a0);
    std::__cxx11::string::~string
              ((string *)&Y.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_420);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2b8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_200);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::PauliX<std::complex<double>_>::~PauliX
            ((PauliX<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::RotationY<std::complex<double>_>::RotationY
            ((RotationY<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,0.0,1.0,false);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_60);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,1,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_738 = 0xc008000000000000;
  uStack_730 = 0;
  local_748._M_value._0_8_ = 0x4014000000000000;
  local_748._M_value._8_8_ = 0;
  local_720 = &local_748;
  local_718 = 2;
  paVar26 = (allocator<std::complex<double>_> *)
            ((long)&gtest_ar__6.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<std::complex<double>_>::allocator(paVar26);
  __l_04._M_len = local_718;
  __l_04._M_array = local_720;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_710,
             __l_04,paVar26);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar__6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_761 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check1_1.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_710);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_760,&local_761,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar1) {
    testing::Message::Message(&local_770);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec2_1.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_760,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x6a,pcVar21);
    testing::internal::AssertHelper::operator=(&local_778,&local_770);
    testing::internal::AssertHelper::~AssertHelper(&local_778);
    std::__cxx11::string::~string
              ((string *)
               &vec2_1.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_b8);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_7e8 = 0xc014000000000000;
  uStack_7e0 = 0;
  local_7f8 = 0xc008000000000000;
  uStack_7f0 = 0;
  local_808 = 0x401c000000000000;
  uStack_800 = 0;
  local_818._M_value._0_8_ = 0x4000000000000000;
  local_818._M_value._8_8_ = 0;
  local_7d8 = &local_818;
  local_7d0 = 4;
  paVar26 = (allocator<std::complex<double>_> *)
            ((long)&gtest_ar__7.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<std::complex<double>_>::allocator(paVar26);
  __l_03._M_len = local_7d0;
  __l_03._M_array = local_7d8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_7c8,
             __l_03,paVar26);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar__7.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_831 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check2_1.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_7c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_830,&local_831,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
  if (!bVar1) {
    testing::Message::Message(&local_840);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_868,(internal *)local_830,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x76,pcVar21);
    testing::internal::AssertHelper::operator=(&local_848,&local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    std::__cxx11::string::~string((string *)&local_868);
    testing::Message::~Message(&local_840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_b8);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4014000000000000;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&gtest_ar__8.message_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_7c8,
             __l_02);
  local_8c9 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check2_1.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_7c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8c8,&local_8c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c8);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3_1.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_8c8,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x82,pcVar21);
    testing::internal::AssertHelper::operator=(&local_8e0,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper(&local_8e0);
    std::__cxx11::string::~string
              ((string *)
               &vec3_1.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_128);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_958 = 0xbff0000000000000;
  uStack_950 = 0;
  local_968 = 0xc010000000000000;
  uStack_960 = 0;
  local_978 = 0x4008000000000000;
  uStack_970 = 0;
  local_988 = 0x4020000000000000;
  uStack_980 = 0;
  local_998 = 0xc014000000000000;
  uStack_990 = 0;
  local_9a8 = 0xc008000000000000;
  uStack_9a0 = 0;
  local_9b8 = 0x401c000000000000;
  uStack_9b0 = 0;
  local_9c8._M_value._0_8_ = 0x4000000000000000;
  local_9c8._M_value._8_8_ = 0;
  local_940 = &local_9c8;
  local_938 = 8;
  paVar26 = (allocator<std::complex<double>_> *)
            ((long)&gtest_ar__9.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<std::complex<double>_>::allocator(paVar26);
  __l_01._M_len = local_938;
  __l_01._M_array = local_940;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_930,
             __l_01,paVar26);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar__9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          &check3_1.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          local_930);
  local_9e1 = (bool)uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9e0,&local_9e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
  if (!bVar1) {
    testing::Message::Message(&local_9f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a18,(internal *)local_9e0,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x8e,pcVar21);
    testing::internal::AssertHelper::operator=(&local_9f8,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper(&local_9f8);
    std::__cxx11::string::~string((string *)&local_a18);
    testing::Message::~Message(&local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_128);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4010000000000000;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&gtest_ar__10.message_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_930,
             __l_00);
  uVar3 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          &check3_1.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          local_930);
  local_ab9 = (bool)uVar3;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ab8,&local_ab9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab8);
  if (!bVar1) {
    testing::Message::Message(&local_ac8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_af0,(internal *)local_ab8,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ad0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x9a,pcVar21);
    testing::internal::AssertHelper::operator=(&local_ad0,&local_ac8);
    testing::internal::AssertHelper::~AssertHelper(&local_ad0);
    std::__cxx11::string::~string((string *)&local_af0);
    testing::Message::~Message(&local_ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,2);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_128);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4014000000000000;
  __l._M_len = 8;
  __l._M_array = (iterator)&gtest_ar__11.message_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_930,__l);
  uVar4 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          &check3_1.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          local_930);
  local_b99 = (bool)uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b98,&local_b99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b98);
  if (!bVar1) {
    testing::Message::Message(&local_ba8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&X_1.super_QGate1<std::complex<double>_>.qubit_,(internal *)local_b98,
               (AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xa6,pcVar21);
    testing::internal::AssertHelper::operator=(&local_bb0,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper(&local_bb0);
    std::__cxx11::string::~string((string *)&X_1.super_QGate1<std::complex<double>_>.qubit_);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b98);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_930);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_7c8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_710);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::RotationY<std::complex<double>_>::~RotationY
            ((RotationY<std::complex<double>_> *)
             &vec1_1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::PauliX<std::complex<double>_>::PauliX
            ((PauliX<std::complex<double>_> *)&mat1.data_,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__12.message_,
             (SquareMatrix<std::complex<double>_> *)&I2.data_);
  uVar23 = 1;
  puVar22 = &gtest_ar__12.message_;
  pcVar21 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&mat1.data_,Left,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)puVar22,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&local_c18);
  uVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)&gtest_ar__12.message_,&local_c18);
  pMVar24 = (Message *)local_c01;
  local_c01[0] = uVar5;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_c01 + 1),(bool *)pMVar24,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_c18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_c01 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_c20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c48,(internal *)(local_c01 + 1),(AssertionResult *)"mat1 == X.matrix()",
               "false","true",pcVar21);
    puVar22 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::__cxx11::string::c_str();
    uVar23 = 0xb7;
    testing::internal::AssertHelper::AssertHelper
              (&local_c28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xb7,(char *)puVar22);
    pMVar24 = &local_c20;
    testing::internal::AssertHelper::operator=(&local_c28,pMVar24);
    testing::internal::AssertHelper::~AssertHelper(&local_c28);
    std::__cxx11::string::~string((string *)&local_c48);
    testing::Message::~Message(&local_c20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_c01 + 1));
  std::complex<double>::complex(&local_c68,2.0,0.0);
  std::complex<double>::complex(&local_c78,3.0,0.0);
  std::complex<double>::complex(&local_c88,5.0,0.0);
  std::complex<double>::complex((complex<double> *)&check1_2.data_,7.0,0.0);
  m10._M_value[1] = in_stack_ffffffffffffe8a9;
  m10._M_value[0] = in_stack_ffffffffffffe8a8;
  m10._M_value[2] = in_stack_ffffffffffffe8aa;
  m10._M_value[3] = in_stack_ffffffffffffe8ab;
  m10._M_value[4] = in_stack_ffffffffffffe8ac;
  m10._M_value[5] = in_stack_ffffffffffffe8ad;
  m10._M_value[6] = in_stack_ffffffffffffe8ae;
  m10._M_value[7] = in_stack_ffffffffffffe8af;
  m10._M_value[8] = in_stack_ffffffffffffe8b0;
  m10._M_value[9] = in_stack_ffffffffffffe8b1;
  m10._M_value[10] = in_stack_ffffffffffffe8b2;
  m10._M_value[0xb] = in_stack_ffffffffffffe8b3;
  m10._M_value[0xc] = in_stack_ffffffffffffe8b4;
  m10._M_value[0xd] = in_stack_ffffffffffffe8b5;
  m10._M_value[0xe] = in_stack_ffffffffffffe8b6;
  m10._M_value[0xf] = in_stack_ffffffffffffe8b7;
  m11._M_value[1] = in_stack_ffffffffffffe8b9;
  m11._M_value[0] = in_stack_ffffffffffffe8b8;
  m11._M_value[2] = in_stack_ffffffffffffe8ba;
  m11._M_value[3] = in_stack_ffffffffffffe8bb;
  m11._M_value[4] = uVar5;
  m11._M_value[5] = uVar4;
  m11._M_value[6] = uVar3;
  m11._M_value[7] = uVar2;
  m11._M_value._8_8_ = paVar26;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = pMVar24;
  m01._M_value._8_8_ = puVar22;
  m01._M_value._0_8_ = uVar23;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_c58,m00,m01,m10,m11);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__12.message_,&local_c58);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_c58);
  uVar25 = 0x4c;
  uVar23 = 1;
  puVar22 = &gtest_ar__12.message_;
  pcVar21 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&mat1.data_,Left,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)puVar22,0);
  std::complex<double>::complex(&local_cb8,3.0,0.0);
  std::complex<double>::complex(&local_cc8,2.0,0.0);
  std::complex<double>::complex(&local_cd8,7.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__13.message_,5.0,0.0);
  m10_00._M_value[1] = in_stack_ffffffffffffe8a9;
  m10_00._M_value[0] = in_stack_ffffffffffffe8a8;
  m10_00._M_value[2] = in_stack_ffffffffffffe8aa;
  m10_00._M_value[3] = in_stack_ffffffffffffe8ab;
  m10_00._M_value[4] = in_stack_ffffffffffffe8ac;
  m10_00._M_value[5] = in_stack_ffffffffffffe8ad;
  m10_00._M_value[6] = in_stack_ffffffffffffe8ae;
  m10_00._M_value[7] = in_stack_ffffffffffffe8af;
  m10_00._M_value[8] = in_stack_ffffffffffffe8b0;
  m10_00._M_value[9] = in_stack_ffffffffffffe8b1;
  m10_00._M_value[10] = in_stack_ffffffffffffe8b2;
  m10_00._M_value[0xb] = in_stack_ffffffffffffe8b3;
  m10_00._M_value[0xc] = in_stack_ffffffffffffe8b4;
  m10_00._M_value[0xd] = in_stack_ffffffffffffe8b5;
  m10_00._M_value[0xe] = in_stack_ffffffffffffe8b6;
  m10_00._M_value[0xf] = in_stack_ffffffffffffe8b7;
  m11_00._M_value[1] = in_stack_ffffffffffffe8b9;
  m11_00._M_value[0] = in_stack_ffffffffffffe8b8;
  m11_00._M_value[2] = in_stack_ffffffffffffe8ba;
  m11_00._M_value[3] = in_stack_ffffffffffffe8bb;
  m11_00._M_value[4] = uVar5;
  m11_00._M_value[5] = uVar4;
  m11_00._M_value[6] = uVar3;
  m11_00._M_value[7] = uVar2;
  m11_00._M_value._8_8_ = paVar26;
  m00_00._M_value._8_8_ = extraout_RDX_00;
  m00_00._M_value._0_8_ = uVar25;
  m01_00._M_value._8_8_ = puVar22;
  m01_00._M_value._0_8_ = uVar23;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_ca8,m00_00,m01_00,m10_00,m11_00);
  uVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)&gtest_ar__12.message_,
                     (SquareMatrix<std::complex<double>_> *)local_ca8);
  local_cf9 = (bool)uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cf8,&local_cf9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf8);
  if (!bVar1) {
    testing::Message::Message(&local_d08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2.data_,(internal *)local_cf8,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xbd,pcVar21);
    testing::internal::AssertHelper::operator=(&local_d10,&local_d08);
    testing::internal::AssertHelper::~AssertHelper(&local_d10);
    std::__cxx11::string::~string((string *)&mat2.data_);
    testing::Message::~Message(&local_d08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__14.message_,
             (SquareMatrix<std::complex<double>_> *)local_28);
  pcVar21 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&mat1.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__14.message_,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&local_d78);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_d68,&local_d78,(SquareMatrix<std::complex<double>_> *)&I2.data_);
  uVar7 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)&gtest_ar__14.message_,&local_d68);
  local_d51 = (bool)uVar7;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d50,&local_d51,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_d68);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_d78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d50);
  if (!bVar1) {
    testing::Message::Message(&local_d80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_d50,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xc2,pcVar21);
    testing::internal::AssertHelper::operator=(&local_d88,&local_d80);
    testing::internal::AssertHelper::~AssertHelper(&local_d88);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_d80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d50);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)&mat1.data_,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__14.message_,
             (SquareMatrix<std::complex<double>_> *)local_28);
  pcVar21 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&mat1.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__14.message_,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&local_de0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_dd0,(SquareMatrix<std::complex<double>_> *)&I2.data_,&local_de0);
  uVar8 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)&gtest_ar__14.message_,&local_dd0);
  local_db9 = (bool)uVar8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_db8,&local_db9,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_dd0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_de0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db8);
  if (!bVar1) {
    testing::Message::Message(&local_de8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3.data_,(internal *)local_db8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_df0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,199,pcVar21);
    testing::internal::AssertHelper::operator=(&local_df0,&local_de8);
    testing::internal::AssertHelper::~AssertHelper(&local_df0);
    std::__cxx11::string::~string((string *)&mat3.data_);
    testing::Message::~Message(&local_de8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_db8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,
             (SquareMatrix<std::complex<double>_> *)
             &v1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar21 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&mat1.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&local_e68);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_e58,&local_e68,(SquareMatrix<std::complex<double>_> *)&I2.data_);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_e48,(SquareMatrix<std::complex<double>_> *)&I2.data_,&local_e58);
  uVar9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_,&local_e48);
  local_e31 = (bool)uVar9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e30,&local_e31,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_e48);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_e58);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_e68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e30);
  if (!bVar1) {
    testing::Message::Message(&local_e70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&X_2.super_QGate1<std::complex<double>_>.qubit_,(internal *)local_e30,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xcd,pcVar21);
    testing::internal::AssertHelper::operator=(&local_e78,&local_e70);
    testing::internal::AssertHelper::~AssertHelper(&local_e78);
    std::__cxx11::string::~string((string *)&X_2.super_QGate1<std::complex<double>_>.qubit_);
    testing::Message::~Message(&local_e70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e30);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__16.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__14.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_ca8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__12.message_);
  qclab::qgates::PauliX<std::complex<double>_>::~PauliX
            ((PauliX<std::complex<double>_> *)&mat1.data_);
  qclab::qgates::PauliX<std::complex<double>_>::PauliX
            ((PauliX<std::complex<double>_> *)&mat1_1.data_,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__17.message_,
             (SquareMatrix<std::complex<double>_> *)&I2.data_);
  uVar23 = 1;
  puVar22 = &gtest_ar__17.message_;
  pcVar21 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&mat1_1.data_,Right,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)puVar22,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&local_ee0);
  uVar10 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__17.message_,&local_ee0);
  pMVar24 = (Message *)local_ec9;
  local_ec9[0] = uVar10;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_ec9 + 1),(bool *)pMVar24,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_ee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_ec9 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_ee8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f10,(internal *)(local_ec9 + 1),(AssertionResult *)"mat1 == X.matrix()",
               "false","true",pcVar21);
    puVar22 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::__cxx11::string::c_str();
    uVar23 = 0xd7;
    testing::internal::AssertHelper::AssertHelper
              (&local_ef0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xd7,(char *)puVar22);
    pMVar24 = &local_ee8;
    testing::internal::AssertHelper::operator=(&local_ef0,pMVar24);
    testing::internal::AssertHelper::~AssertHelper(&local_ef0);
    std::__cxx11::string::~string((string *)&local_f10);
    testing::Message::~Message(&local_ee8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_ec9 + 1));
  std::complex<double>::complex(&local_f30,2.0,0.0);
  std::complex<double>::complex(&local_f40,3.0,0.0);
  std::complex<double>::complex(&local_f50,5.0,0.0);
  std::complex<double>::complex((complex<double> *)&check1_3.data_,7.0,0.0);
  m10_01._M_value[1] = in_stack_ffffffffffffe8a9;
  m10_01._M_value[0] = in_stack_ffffffffffffe8a8;
  m10_01._M_value[2] = in_stack_ffffffffffffe8aa;
  m10_01._M_value[3] = in_stack_ffffffffffffe8ab;
  m10_01._M_value[4] = in_stack_ffffffffffffe8ac;
  m10_01._M_value[5] = in_stack_ffffffffffffe8ad;
  m10_01._M_value[6] = in_stack_ffffffffffffe8ae;
  m10_01._M_value[7] = in_stack_ffffffffffffe8af;
  m10_01._M_value[8] = in_stack_ffffffffffffe8b0;
  m10_01._M_value[9] = in_stack_ffffffffffffe8b1;
  m10_01._M_value[10] = in_stack_ffffffffffffe8b2;
  m10_01._M_value[0xb] = in_stack_ffffffffffffe8b3;
  m10_01._M_value[0xc] = in_stack_ffffffffffffe8b4;
  m10_01._M_value[0xd] = in_stack_ffffffffffffe8b5;
  m10_01._M_value[0xe] = in_stack_ffffffffffffe8b6;
  m10_01._M_value[0xf] = uVar10;
  m11_01._M_value[1] = uVar8;
  m11_01._M_value[0] = uVar9;
  m11_01._M_value[2] = uVar7;
  m11_01._M_value[3] = uVar6;
  m11_01._M_value[4] = uVar5;
  m11_01._M_value[5] = uVar4;
  m11_01._M_value[6] = uVar3;
  m11_01._M_value[7] = uVar2;
  m11_01._M_value._8_8_ = paVar26;
  m00_01._M_value._8_8_ = extraout_RDX_01;
  m00_01._M_value._0_8_ = pMVar24;
  m01_01._M_value._8_8_ = puVar22;
  m01_01._M_value._0_8_ = uVar23;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_f20,m00_01,m01_01,m10_01,m11_01);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__17.message_,&local_f20);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_f20);
  uVar25 = 0x52;
  uVar23 = 1;
  puVar22 = &gtest_ar__17.message_;
  pcVar21 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&mat1_1.data_,Right,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)puVar22,0);
  std::complex<double>::complex(&local_f80,5.0,0.0);
  std::complex<double>::complex(&local_f90,7.0,0.0);
  std::complex<double>::complex(&local_fa0,2.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__18.message_,3.0,0.0);
  m10_02._M_value[1] = in_stack_ffffffffffffe8a9;
  m10_02._M_value[0] = in_stack_ffffffffffffe8a8;
  m10_02._M_value[2] = in_stack_ffffffffffffe8aa;
  m10_02._M_value[3] = in_stack_ffffffffffffe8ab;
  m10_02._M_value[4] = in_stack_ffffffffffffe8ac;
  m10_02._M_value[5] = in_stack_ffffffffffffe8ad;
  m10_02._M_value[6] = in_stack_ffffffffffffe8ae;
  m10_02._M_value[7] = in_stack_ffffffffffffe8af;
  m10_02._M_value[8] = in_stack_ffffffffffffe8b0;
  m10_02._M_value[9] = in_stack_ffffffffffffe8b1;
  m10_02._M_value[10] = in_stack_ffffffffffffe8b2;
  m10_02._M_value[0xb] = in_stack_ffffffffffffe8b3;
  m10_02._M_value[0xc] = in_stack_ffffffffffffe8b4;
  m10_02._M_value[0xd] = in_stack_ffffffffffffe8b5;
  m10_02._M_value[0xe] = in_stack_ffffffffffffe8b6;
  m10_02._M_value[0xf] = uVar10;
  m11_02._M_value[1] = uVar8;
  m11_02._M_value[0] = uVar9;
  m11_02._M_value[2] = uVar7;
  m11_02._M_value[3] = uVar6;
  m11_02._M_value[4] = uVar5;
  m11_02._M_value[5] = uVar4;
  m11_02._M_value[6] = uVar3;
  m11_02._M_value[7] = uVar2;
  m11_02._M_value._8_8_ = paVar26;
  m00_02._M_value._8_8_ = extraout_RDX_02;
  m00_02._M_value._0_8_ = uVar25;
  m01_02._M_value._8_8_ = puVar22;
  m01_02._M_value._0_8_ = uVar23;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_f70,m00_02,m01_02,m10_02,m11_02);
  uVar11 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__17.message_,
                      (SquareMatrix<std::complex<double>_> *)local_f70);
  local_fc1 = (bool)uVar11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fc0,&local_fc1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fc0);
  if (!bVar1) {
    testing::Message::Message(&local_fd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_1.data_,(internal *)local_fc0,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xdd,pcVar21);
    testing::internal::AssertHelper::operator=(&local_fd8,&local_fd0);
    testing::internal::AssertHelper::~AssertHelper(&local_fd8);
    std::__cxx11::string::~string((string *)&mat2_1.data_);
    testing::Message::~Message(&local_fd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fc0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,
             (SquareMatrix<std::complex<double>_> *)local_28);
  pcVar21 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&mat1_1.data_,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&local_1040)
  ;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1030,&local_1040,(SquareMatrix<std::complex<double>_> *)&I2.data_);
  uVar12 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,&local_1030);
  local_1019 = (bool)uVar12;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1018,&local_1019,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1030);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1040);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1018);
  if (!bVar1) {
    testing::Message::Message(&local_1048);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_1018,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1050,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe2,pcVar21);
    testing::internal::AssertHelper::operator=(&local_1050,&local_1048);
    testing::internal::AssertHelper::~AssertHelper(&local_1050);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_1048);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1018);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)&mat1_1.data_,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,
             (SquareMatrix<std::complex<double>_> *)local_28);
  pcVar21 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&mat1_1.data_,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&local_10a8)
  ;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1098,(SquareMatrix<std::complex<double>_> *)&I2.data_,&local_10a8);
  uVar13 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_,&local_1098);
  local_1081 = (bool)uVar13;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1080,&local_1081,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1098);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_10a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1080);
  if (!bVar1) {
    testing::Message::Message(&local_10b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_1.data_,(internal *)local_1080,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_10b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe7,pcVar21);
    testing::internal::AssertHelper::operator=(&local_10b8,&local_10b0);
    testing::internal::AssertHelper::~AssertHelper(&local_10b8);
    std::__cxx11::string::~string((string *)&mat3_1.data_);
    testing::Message::~Message(&local_10b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1080);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__21.message_,
             (SquareMatrix<std::complex<double>_> *)
             &v1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar21 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&mat1_1.data_,Right,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__21.message_,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&local_1130)
  ;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1120,&local_1130,(SquareMatrix<std::complex<double>_> *)&I2.data_);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1110,(SquareMatrix<std::complex<double>_> *)&I2.data_,&local_1120);
  uVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__21.message_,&local_1110);
  local_10f9 = (bool)uVar14;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10f8,&local_10f9,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1110);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1120);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10f8);
  if (!bVar1) {
    testing::Message::Message(&local_1138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_,
               (internal *)local_10f8,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xed,pcVar21);
    testing::internal::AssertHelper::operator=(&local_1140,&local_1138);
    testing::internal::AssertHelper::~AssertHelper(&local_1140);
    std::__cxx11::string::~string
              ((string *)&Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_);
    testing::Message::~Message(&local_1138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__21.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__19.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_f70);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__17.message_);
  qclab::qgates::PauliX<std::complex<double>_>::~PauliX
            ((PauliX<std::complex<double>_> *)&mat1_1.data_);
  qclab::qgates::RotationY<std::complex<double>_>::RotationY
            ((RotationY<std::complex<double>_> *)&Ytrans.data_,0,0.0,1.0,false);
  qclab::qgates::RotationY<std::complex<double>_>::matrix
            ((RotationY<std::complex<double>_> *)&mat1_2.data_);
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)local_1190,(SquareMatrix<std::complex<double>_> *)&mat1_2.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&mat1_2.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__22.message_,
             (SquareMatrix<std::complex<double>_> *)&I2.data_);
  uVar23 = 1;
  puVar22 = &gtest_ar__22.message_;
  pcVar21 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&Ytrans.data_,Left,Trans,1,
             (SquareMatrix<std::complex<double>_> *)puVar22,0);
  uVar15 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__22.message_,
                      (SquareMatrix<std::complex<double>_> *)local_1190);
  pMVar24 = (Message *)local_11c1;
  local_11c1[0] = uVar15;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_11c1 + 1),(bool *)pMVar24,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_11c1 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_11d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_11f8,(internal *)(local_11c1 + 1),(AssertionResult *)"mat1 == Ytrans","false",
               "true",pcVar21);
    puVar22 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::__cxx11::string::c_str();
    uVar23 = 0xf8;
    testing::internal::AssertHelper::AssertHelper
              (&local_11d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xf8,(char *)puVar22);
    pMVar24 = &local_11d0;
    testing::internal::AssertHelper::operator=(&local_11d8,pMVar24);
    testing::internal::AssertHelper::~AssertHelper(&local_11d8);
    std::__cxx11::string::~string((string *)&local_11f8);
    testing::Message::~Message(&local_11d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_11c1 + 1));
  std::complex<double>::complex(&local_1218,2.0,0.0);
  std::complex<double>::complex(&local_1228,3.0,0.0);
  std::complex<double>::complex(&local_1238,5.0,0.0);
  std::complex<double>::complex((complex<double> *)&check1_4.data_,7.0,0.0);
  m10_03._M_value[1] = in_stack_ffffffffffffe8a9;
  m10_03._M_value[0] = in_stack_ffffffffffffe8a8;
  m10_03._M_value[2] = in_stack_ffffffffffffe8aa;
  m10_03._M_value[3] = in_stack_ffffffffffffe8ab;
  m10_03._M_value[4] = in_stack_ffffffffffffe8ac;
  m10_03._M_value[5] = in_stack_ffffffffffffe8ad;
  m10_03._M_value[6] = in_stack_ffffffffffffe8ae;
  m10_03._M_value[7] = in_stack_ffffffffffffe8af;
  m10_03._M_value[8] = in_stack_ffffffffffffe8b0;
  m10_03._M_value[9] = in_stack_ffffffffffffe8b1;
  m10_03._M_value[10] = uVar15;
  m10_03._M_value[0xb] = uVar14;
  m10_03._M_value[0xc] = uVar13;
  m10_03._M_value[0xd] = uVar12;
  m10_03._M_value[0xe] = uVar11;
  m10_03._M_value[0xf] = uVar10;
  m11_03._M_value[1] = uVar8;
  m11_03._M_value[0] = uVar9;
  m11_03._M_value[2] = uVar7;
  m11_03._M_value[3] = uVar6;
  m11_03._M_value[4] = uVar5;
  m11_03._M_value[5] = uVar4;
  m11_03._M_value[6] = uVar3;
  m11_03._M_value[7] = uVar2;
  m11_03._M_value._8_8_ = paVar26;
  m00_03._M_value._8_8_ = extraout_RDX_03;
  m00_03._M_value._0_8_ = pMVar24;
  m01_03._M_value._8_8_ = puVar22;
  m01_03._M_value._0_8_ = uVar23;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1208,m00_03,m01_03,m10_03,m11_03);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__22.message_,&local_1208);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1208);
  uVar25 = 0x4c;
  uVar23 = 1;
  puVar22 = &gtest_ar__22.message_;
  pcVar21 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&Ytrans.data_,Left,Trans,1,
             (SquareMatrix<std::complex<double>_> *)puVar22,0);
  std::complex<double>::complex(&local_1268,-3.0,0.0);
  std::complex<double>::complex(&local_1278,2.0,0.0);
  std::complex<double>::complex(&local_1288,-7.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__23.message_,5.0,0.0);
  m10_04._M_value[1] = in_stack_ffffffffffffe8a9;
  m10_04._M_value[0] = in_stack_ffffffffffffe8a8;
  m10_04._M_value[2] = in_stack_ffffffffffffe8aa;
  m10_04._M_value[3] = in_stack_ffffffffffffe8ab;
  m10_04._M_value[4] = in_stack_ffffffffffffe8ac;
  m10_04._M_value[5] = in_stack_ffffffffffffe8ad;
  m10_04._M_value[6] = in_stack_ffffffffffffe8ae;
  m10_04._M_value[7] = in_stack_ffffffffffffe8af;
  m10_04._M_value[8] = in_stack_ffffffffffffe8b0;
  m10_04._M_value[9] = in_stack_ffffffffffffe8b1;
  m10_04._M_value[10] = uVar15;
  m10_04._M_value[0xb] = uVar14;
  m10_04._M_value[0xc] = uVar13;
  m10_04._M_value[0xd] = uVar12;
  m10_04._M_value[0xe] = uVar11;
  m10_04._M_value[0xf] = uVar10;
  m11_04._M_value[1] = uVar8;
  m11_04._M_value[0] = uVar9;
  m11_04._M_value[2] = uVar7;
  m11_04._M_value[3] = uVar6;
  m11_04._M_value[4] = uVar5;
  m11_04._M_value[5] = uVar4;
  m11_04._M_value[6] = uVar3;
  m11_04._M_value[7] = uVar2;
  m11_04._M_value._8_8_ = paVar26;
  m00_04._M_value._8_8_ = extraout_RDX_04;
  m00_04._M_value._0_8_ = uVar25;
  m01_04._M_value._8_8_ = puVar22;
  m01_04._M_value._0_8_ = uVar23;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1258,m00_04,m01_04,m10_04,m11_04);
  uVar16 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__22.message_,
                      (SquareMatrix<std::complex<double>_> *)local_1258);
  local_12a9 = (bool)uVar16;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_12a8,&local_12a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12a8);
  if (!bVar1) {
    testing::Message::Message(&local_12b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_2.data_,(internal *)local_12a8,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xfe,pcVar21);
    testing::internal::AssertHelper::operator=(&local_12c0,&local_12b8);
    testing::internal::AssertHelper::~AssertHelper(&local_12c0);
    std::__cxx11::string::~string((string *)&mat2_2.data_);
    testing::Message::~Message(&local_12b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12a8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__24.message_,
             (SquareMatrix<std::complex<double>_> *)local_28);
  pcVar21 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&Ytrans.data_,Left,Trans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__24.message_,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1318,(SquareMatrix<std::complex<double>_> *)local_1190,
             (SquareMatrix<std::complex<double>_> *)&I2.data_);
  uVar17 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__24.message_,&local_1318);
  local_1301 = (bool)uVar17;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1300,&local_1301,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1300);
  if (!bVar1) {
    testing::Message::Message(&local_1320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_1300,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar21
              );
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x103,pcVar21);
    testing::internal::AssertHelper::operator=(&local_1328,&local_1320);
    testing::internal::AssertHelper::~AssertHelper(&local_1328);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_1320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1300);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)&Ytrans.data_,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__24.message_,
             (SquareMatrix<std::complex<double>_> *)local_28);
  pcVar21 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&Ytrans.data_,Left,Trans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__24.message_,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1370,(SquareMatrix<std::complex<double>_> *)&I2.data_,
             (SquareMatrix<std::complex<double>_> *)local_1190);
  uVar18 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__24.message_,&local_1370);
  local_1359 = (bool)uVar18;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1358,&local_1359,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1358);
  if (!bVar1) {
    testing::Message::Message(&local_1378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_2.data_,(internal *)local_1358,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar21
              );
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x108,pcVar21);
    testing::internal::AssertHelper::operator=(&local_1380,&local_1378);
    testing::internal::AssertHelper::~AssertHelper(&local_1380);
    std::__cxx11::string::~string((string *)&mat3_2.data_);
    testing::Message::~Message(&local_1378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1358);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_,
             (SquareMatrix<std::complex<double>_> *)
             &v1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar21 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&Ytrans.data_,Left,Trans,3,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_13e8,(SquareMatrix<std::complex<double>_> *)local_1190,
             (SquareMatrix<std::complex<double>_> *)&I2.data_);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_13d8,(SquareMatrix<std::complex<double>_> *)&I2.data_,&local_13e8);
  uVar19 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_,&local_13d8);
  local_13c1 = (bool)uVar19;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_13c0,&local_13c1,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_13d8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_13e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13c0);
  if (!bVar1) {
    testing::Message::Message(&local_13f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_2.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_,
               (internal *)local_13c0,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_13f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x10e,pcVar21);
    testing::internal::AssertHelper::operator=(&local_13f8,&local_13f0);
    testing::internal::AssertHelper::~AssertHelper(&local_13f8);
    std::__cxx11::string::~string
              ((string *)&Y_2.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_);
    testing::Message::~Message(&local_13f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13c0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__24.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1258);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__22.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1190);
  qclab::qgates::RotationY<std::complex<double>_>::~RotationY
            ((RotationY<std::complex<double>_> *)&Ytrans.data_);
  qclab::qgates::RotationY<std::complex<double>_>::RotationY
            ((RotationY<std::complex<double>_> *)&Ytrans_1.data_,0,0.0,1.0,false);
  qclab::qgates::RotationY<std::complex<double>_>::matrix
            ((RotationY<std::complex<double>_> *)&mat1_3.data_);
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)local_1448,(SquareMatrix<std::complex<double>_> *)&mat1_3.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&mat1_3.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__27.message_,
             (SquareMatrix<std::complex<double>_> *)&I2.data_);
  uVar23 = 1;
  puVar22 = &gtest_ar__27.message_;
  pcVar21 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&Ytrans_1.data_,Right,Trans,1,
             (SquareMatrix<std::complex<double>_> *)puVar22,0);
  uVar20 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                     ((SquareMatrix<std::complex<double>_> *)&gtest_ar__27.message_,
                      (SquareMatrix<std::complex<double>_> *)local_1448);
  pMVar24 = (Message *)local_1479;
  local_1479[0] = uVar20;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_1479 + 1),(bool *)pMVar24,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1479 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_1488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_14b0,(internal *)(local_1479 + 1),(AssertionResult *)"mat1 == Ytrans","false",
               "true",pcVar21);
    puVar22 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::__cxx11::string::c_str();
    uVar23 = 0x119;
    testing::internal::AssertHelper::AssertHelper
              (&local_1490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x119,(char *)puVar22);
    pMVar24 = &local_1488;
    testing::internal::AssertHelper::operator=(&local_1490,pMVar24);
    testing::internal::AssertHelper::~AssertHelper(&local_1490);
    std::__cxx11::string::~string((string *)&local_14b0);
    testing::Message::~Message(&local_1488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1479 + 1));
  std::complex<double>::complex(&local_14d0,2.0,0.0);
  std::complex<double>::complex(&local_14e0,3.0,0.0);
  std::complex<double>::complex(&local_14f0,5.0,0.0);
  std::complex<double>::complex((complex<double> *)&check1_5.data_,7.0,0.0);
  m10_05._M_value[1] = in_stack_ffffffffffffe8a9;
  m10_05._M_value[0] = in_stack_ffffffffffffe8a8;
  m10_05._M_value[2] = in_stack_ffffffffffffe8aa;
  m10_05._M_value[3] = in_stack_ffffffffffffe8ab;
  m10_05._M_value[4] = in_stack_ffffffffffffe8ac;
  m10_05._M_value[5] = uVar20;
  m10_05._M_value[6] = uVar19;
  m10_05._M_value[7] = uVar18;
  m10_05._M_value[8] = uVar17;
  m10_05._M_value[9] = uVar16;
  m10_05._M_value[10] = uVar15;
  m10_05._M_value[0xb] = uVar14;
  m10_05._M_value[0xc] = uVar13;
  m10_05._M_value[0xd] = uVar12;
  m10_05._M_value[0xe] = uVar11;
  m10_05._M_value[0xf] = uVar10;
  m11_05._M_value[1] = uVar8;
  m11_05._M_value[0] = uVar9;
  m11_05._M_value[2] = uVar7;
  m11_05._M_value[3] = uVar6;
  m11_05._M_value[4] = uVar5;
  m11_05._M_value[5] = uVar4;
  m11_05._M_value[6] = uVar3;
  m11_05._M_value[7] = uVar2;
  m11_05._M_value._8_8_ = paVar26;
  m00_05._M_value._8_8_ = extraout_RDX_05;
  m00_05._M_value._0_8_ = pMVar24;
  m01_05._M_value._8_8_ = puVar22;
  m01_05._M_value._0_8_ = uVar23;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_14c0,m00_05,m01_05,m10_05,m11_05);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__27.message_,&local_14c0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_14c0);
  uVar25 = 0x52;
  uVar23 = 1;
  puVar22 = &gtest_ar__27.message_;
  pcVar21 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&Ytrans_1.data_,Right,Trans,1,
             (SquareMatrix<std::complex<double>_> *)puVar22,0);
  std::complex<double>::complex(&local_1520,5.0,0.0);
  std::complex<double>::complex(&local_1530,7.0,0.0);
  std::complex<double>::complex(&local_1540,-2.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__28.message_,-3.0,0.0);
  m10_06._M_value[1] = in_stack_ffffffffffffe8a9;
  m10_06._M_value[0] = in_stack_ffffffffffffe8a8;
  m10_06._M_value[2] = in_stack_ffffffffffffe8aa;
  m10_06._M_value[3] = in_stack_ffffffffffffe8ab;
  m10_06._M_value[4] = in_stack_ffffffffffffe8ac;
  m10_06._M_value[5] = uVar20;
  m10_06._M_value[6] = uVar19;
  m10_06._M_value[7] = uVar18;
  m10_06._M_value[8] = uVar17;
  m10_06._M_value[9] = uVar16;
  m10_06._M_value[10] = uVar15;
  m10_06._M_value[0xb] = uVar14;
  m10_06._M_value[0xc] = uVar13;
  m10_06._M_value[0xd] = uVar12;
  m10_06._M_value[0xe] = uVar11;
  m10_06._M_value[0xf] = uVar10;
  m11_06._M_value[1] = uVar8;
  m11_06._M_value[0] = uVar9;
  m11_06._M_value[2] = uVar7;
  m11_06._M_value[3] = uVar6;
  m11_06._M_value[4] = uVar5;
  m11_06._M_value[5] = uVar4;
  m11_06._M_value[6] = uVar3;
  m11_06._M_value[7] = uVar2;
  m11_06._M_value._8_8_ = paVar26;
  m00_06._M_value._8_8_ = extraout_RDX_06;
  m00_06._M_value._0_8_ = uVar25;
  m01_06._M_value._8_8_ = puVar22;
  m01_06._M_value._0_8_ = uVar23;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1510,m00_06,m01_06,m10_06,m11_06);
  local_1561 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__27.message_,
                          (SquareMatrix<std::complex<double>_> *)local_1510);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1560,&local_1561,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1560);
  if (!bVar1) {
    testing::Message::Message(&local_1570);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_3.data_,(internal *)local_1560,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x11f,pcVar21);
    testing::internal::AssertHelper::operator=(&local_1578,&local_1570);
    testing::internal::AssertHelper::~AssertHelper(&local_1578);
    std::__cxx11::string::~string((string *)&mat2_3.data_);
    testing::Message::~Message(&local_1570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1560);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__29.message_,
             (SquareMatrix<std::complex<double>_> *)local_28);
  pcVar21 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&Ytrans_1.data_,Right,Trans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__29.message_,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_15d0,(SquareMatrix<std::complex<double>_> *)local_1448,
             (SquareMatrix<std::complex<double>_> *)&I2.data_);
  local_15b9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__29.message_,&local_15d0)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_15b8,&local_15b9,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_15d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15b8);
  if (!bVar1) {
    testing::Message::Message(&local_15d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_15b8,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar21
              );
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_15e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x124,pcVar21);
    testing::internal::AssertHelper::operator=(&local_15e0,&local_15d8);
    testing::internal::AssertHelper::~AssertHelper(&local_15e0);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_15d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15b8);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)&Ytrans_1.data_,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__29.message_,
             (SquareMatrix<std::complex<double>_> *)local_28);
  pcVar21 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&Ytrans_1.data_,Right,Trans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__29.message_,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1628,(SquareMatrix<std::complex<double>_> *)&I2.data_,
             (SquareMatrix<std::complex<double>_> *)local_1448);
  local_1611 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__29.message_,&local_1628)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1610,&local_1611,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1628);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1610);
  if (!bVar1) {
    testing::Message::Message(&local_1630);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_3.data_,(internal *)local_1610,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar21
              );
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x129,pcVar21);
    testing::internal::AssertHelper::operator=(&local_1638,&local_1630);
    testing::internal::AssertHelper::~AssertHelper(&local_1638);
    std::__cxx11::string::~string((string *)&mat3_3.data_);
    testing::Message::~Message(&local_1630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1610);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__31.message_,
             (SquareMatrix<std::complex<double>_> *)
             &v1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar21 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&Ytrans_1.data_,Right,Trans,3,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar__31.message_,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_16a0,(SquareMatrix<std::complex<double>_> *)local_1448,
             (SquareMatrix<std::complex<double>_> *)&I2.data_);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1690,(SquareMatrix<std::complex<double>_> *)&I2.data_,&local_16a0);
  local_1679 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__31.message_,&local_1690)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1678,&local_1679,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1690);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_16a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1678);
  if (!bVar1) {
    testing::Message::Message(&local_16a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_16d0,(internal *)local_1678,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar21);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x12f,pcVar21);
    testing::internal::AssertHelper::operator=(&local_16b0,&local_16a8);
    testing::internal::AssertHelper::~AssertHelper(&local_16b0);
    std::__cxx11::string::~string((string *)&local_16d0);
    testing::Message::~Message(&local_16a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1678);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__31.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__29.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1510);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__27.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1448);
  qclab::qgates::RotationY<std::complex<double>_>::~RotationY
            ((RotationY<std::complex<double>_> *)&Ytrans_1.data_);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_128);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_b8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_60);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)
             &v1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_28);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&I2.data_);
  return;
}

Assistant:

void test_qclab_qgates_QGate1() {

  using R = qclab::real_t< T > ;
  using V = std::vector< T > ;
  using M = qclab::dense::SquareMatrix< T > ;

  const auto I1 = qclab::dense::eye< T >( 2 ) ;
  const auto I2 = qclab::dense::eye< T >( 4 ) ;
  const auto I3 = qclab::dense::eye< T >( 8 ) ;

  const V v1 = { 3 , 5 } ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;

  // apply (NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    X.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { 5 , 3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { X.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , 3 , 5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    X.setQubit( 1 ) ;
    vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    check2 = { 5 , 3 , 7 , 2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , 3 , 5 , 8 , 3 , 4 , 1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 0 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , 3 , 5 , 2 , 7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 2 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 5 , 3 , 7 , 2 , 1 , 4 , 3 , 8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  // apply (Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    Y.apply( qclab::Op::Trans , 1 , vec1 ) ;
    V check1 = { 5 , -3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { Y.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , -3 , -5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    Y.setQubit( 1 ) ;
    vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check2 = { 5 , -3 , 7 , -2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , -3 , -5 , 8 , 3 , -4 , -1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 0 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , -3 , -5 , -2 , -7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 2 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 5 , -3 , 7 , -2 , 1 , -4 , 3 , -8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }


  // apply (Left + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 3 , 2 ,
              7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Right + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 5 , 7 ,
              2 , 3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Left + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    M check1( -3 , 2 ,
              -7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

  // apply (Right + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    M check1(  5 ,  7 ,
              -2 , -3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

}